

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDD.cpp
# Opt level: O0

void __thiscall HDD::Reset(HDD *this)

{
  string *psVar1;
  HDD *this_local;
  
  this->h = -1;
  this->sectors = 0;
  this->heads = 0;
  this->cyls = 0;
  this->total_bytes = 0;
  this->total_sectors = 0;
  this->data_offset = 0;
  this->sector_size = 0;
  memset(&this->sIdentify,0,0x204);
  psVar1 = (string *)std::__cxx11::string::operator=((string *)&this->strFirmwareRevision,"");
  psVar1 = (string *)std::__cxx11::string::operator=((string *)&this->strSerialNumber,psVar1);
  std::__cxx11::string::operator=((string *)&this->strMakeModel,psVar1);
  return;
}

Assistant:

void HDD::Reset()
{
    h = -1;

    cyls = heads = sectors = 0;
    total_sectors = total_bytes = 0;
    sector_size = data_offset = 0;

    memset(&sIdentify, 0, sizeof(sIdentify));

    strMakeModel = strSerialNumber = strFirmwareRevision = "";
}